

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdpostct.c
# Opt level: O0

void post_process_prepass
               (j_decompress_ptr cinfo,JSAMPIMAGE input_buf,JDIMENSION *in_row_group_ctr,
               JDIMENSION in_row_groups_avail,JSAMPARRAY output_buf,JDIMENSION *out_row_ctr,
               JDIMENSION out_rows_avail)

{
  uint uVar1;
  long lVar2;
  int iVar3;
  undefined8 uVar4;
  undefined4 in_ECX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long in_RDI;
  int *in_R9;
  JDIMENSION num_rows;
  JDIMENSION old_next_row;
  my_post_ptr post;
  
  lVar2 = *(long *)(in_RDI + 0x238);
  if (*(int *)(lVar2 + 0x28) == 0) {
    uVar4 = (**(code **)(*(long *)(in_RDI + 8) + 0x38))
                      (in_RDI,*(undefined8 *)(lVar2 + 0x10),*(undefined4 *)(lVar2 + 0x24),
                       *(undefined4 *)(lVar2 + 0x20),1);
    *(undefined8 *)(lVar2 + 0x18) = uVar4;
  }
  uVar1 = *(uint *)(lVar2 + 0x28);
  (**(code **)(*(long *)(in_RDI + 0x260) + 8))
            (in_RDI,in_RSI,in_RDX,in_ECX,*(undefined8 *)(lVar2 + 0x18),lVar2 + 0x28,
             *(undefined4 *)(lVar2 + 0x20));
  if (uVar1 < *(uint *)(lVar2 + 0x28)) {
    iVar3 = *(int *)(lVar2 + 0x28) - uVar1;
    (**(code **)(*(long *)(in_RDI + 0x270) + 8))
              (in_RDI,*(long *)(lVar2 + 0x18) + (ulong)uVar1 * 8,0,iVar3);
    *in_R9 = iVar3 + *in_R9;
  }
  if (*(uint *)(lVar2 + 0x20) <= *(uint *)(lVar2 + 0x28)) {
    *(int *)(lVar2 + 0x24) = *(int *)(lVar2 + 0x20) + *(int *)(lVar2 + 0x24);
    *(undefined4 *)(lVar2 + 0x28) = 0;
  }
  return;
}

Assistant:

METHODDEF(void)
post_process_prepass(j_decompress_ptr cinfo, JSAMPIMAGE input_buf,
                     JDIMENSION *in_row_group_ctr,
                     JDIMENSION in_row_groups_avail, JSAMPARRAY output_buf,
                     JDIMENSION *out_row_ctr, JDIMENSION out_rows_avail)
{
  my_post_ptr post = (my_post_ptr)cinfo->post;
  JDIMENSION old_next_row, num_rows;

  /* Reposition virtual buffer if at start of strip. */
  if (post->next_row == 0) {
    post->buffer = (*cinfo->mem->access_virt_sarray)
        ((j_common_ptr)cinfo, post->whole_image,
         post->starting_row, post->strip_height, TRUE);
  }

  /* Upsample some data (up to a strip height's worth). */
  old_next_row = post->next_row;
  (*cinfo->upsample->upsample) (cinfo, input_buf, in_row_group_ctr,
                                in_row_groups_avail, post->buffer,
                                &post->next_row, post->strip_height);

  /* Allow quantizer to scan new data.  No data is emitted, */
  /* but we advance out_row_ctr so outer loop can tell when we're done. */
  if (post->next_row > old_next_row) {
    num_rows = post->next_row - old_next_row;
    (*cinfo->cquantize->color_quantize) (cinfo, post->buffer + old_next_row,
                                         (JSAMPARRAY)NULL, (int)num_rows);
    *out_row_ctr += num_rows;
  }

  /* Advance if we filled the strip. */
  if (post->next_row >= post->strip_height) {
    post->starting_row += post->strip_height;
    post->next_row = 0;
  }
}